

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typemapper.hpp
# Opt level: O2

string * __thiscall
jsonrpccxx::type_name_abi_cxx11_(string *__return_storage_ptr__,jsonrpccxx *this,value_t t)

{
  allocator<char> *__a;
  char *__s;
  allocator<char> local_10;
  allocator<char> local_f;
  allocator<char> local_e;
  allocator<char> local_d;
  allocator<char> local_c;
  allocator<char> local_b;
  allocator<char> local_a;
  allocator<char> local_9;
  
  switch((int)this) {
  case 1:
    __s = "object";
    __a = &local_d;
    break;
  case 2:
    __s = "array";
    __a = &local_e;
    break;
  case 3:
    __s = "string";
    __a = &local_f;
    break;
  case 4:
    __s = "boolean";
    __a = &local_a;
    break;
  case 5:
    __s = "integer";
    __a = &local_9;
    break;
  case 6:
    __s = "unsigned integer";
    __a = &local_c;
    break;
  case 7:
    __s = "float";
    __a = &local_b;
    break;
  default:
    __s = "null";
    __a = &local_10;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

inline std::string type_name(json::value_t t) {
    switch (t) {
    case json::value_t::number_integer:
      return "integer";
    case json::value_t::boolean:
      return "boolean";
    case json::value_t::number_float:
      return "float";
    case json::value_t::number_unsigned:
      return "unsigned integer";
    case json::value_t::object:
      return "object";
    case json::value_t::array:
      return "array";
    case json::value_t::string:
      return "string";
    default:
      return "null";
    }
  }